

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_PermuteExtensions_Test::TestBody(SSLTest_PermuteExtensions_Test *this)

{
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  SSL_METHOD *pSVar4;
  SSL_CTX *pSVar5;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> ech_keys;
  char *pcVar6;
  char *in_R9;
  int iVar7;
  pointer *__ptr;
  long lVar8;
  bool decrypt_ech;
  ScopedTrace gtest_trace_9202;
  bool offer_ech;
  ScopedTrace gtest_trace_9205;
  UniquePtr<SSL_CTX> ctx;
  vector<unsigned_short,_std::allocator<unsigned_short>_> order1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> order2;
  UniquePtr<SSL_ECH_KEYS> keys;
  bool local_d3;
  ScopedTrace local_d2;
  bool local_d1;
  AssertHelper local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  ScopedTrace local_b9;
  AssertHelper local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  pointer local_78;
  char local_64 [4];
  AssertHelper local_60;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_58;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_40;
  long local_38;
  
  MakeTestECHKeys((anon_unknown_0 *)&local_40,'\x01');
  local_88[0] = local_40._M_head_impl != (SSL_ECH_KEYS *)0x0;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_40._M_head_impl == (SSL_ECH_KEYS *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)local_88,(AssertionResult *)0x338821,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x23f0,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
    }
    if (local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_58.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
LAB_001d61c0:
    std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_40);
    return;
  }
  local_64[2] = '\0';
  local_64[3] = '\x01';
  lVar8 = 0;
LAB_001d599a:
  local_d1 = (bool)local_64[lVar8 + 2];
  testing::ScopedTrace::ScopedTrace<bool>
            (&local_d2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
             ,0x23f2,&local_d1);
  local_38 = lVar8;
  ech_keys._M_head_impl = (SSL_ECH_KEYS *)0x0;
  if (local_d1 != false) {
    ech_keys._M_head_impl = local_40._M_head_impl;
  }
  local_64[0] = '\0';
  local_64[1] = '\x01';
  lVar8 = 0;
LAB_001d59d9:
  local_d3 = (bool)local_64[lVar8];
  testing::ScopedTrace::ScopedTrace<bool>
            (&local_b9,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
             ,0x23f5,&local_d3);
  if ((local_d1 != false) || (local_d3 != true)) {
    pSVar4 = (SSL_METHOD *)TLS_method();
    local_90._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(pSVar4);
    local_88[0] = local_90._M_head_impl != (SSL_CTX *)0x0;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_90._M_head_impl != (SSL_CTX *)0x0) {
      local_78 = (pointer)0x0;
      local_88 = (undefined1  [8])0x0;
      pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar2 = GetExtensionOrder(local_90._M_head_impl,
                                (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,
                                ech_keys._M_head_impl,local_d3);
      local_d0.data_._0_1_ = bVar2;
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2) {
        bVar2 = GetExtensionOrder(local_90._M_head_impl,&local_58,ech_keys._M_head_impl,local_d3);
        local_d0.data_._0_1_ = bVar2;
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::internal::
          CmpHelperEQ<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::vector<unsigned_short,std::allocator<unsigned_short>>>
                    ((internal *)local_b0,"order1","order2",
                     (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,&local_58);
          if (local_b0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_d0);
            pcVar6 = "";
            if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar6 = (local_a8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2402,pcVar6);
            testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
            testing::internal::AssertHelper::~AssertHelper(&local_b8);
            if (local_d0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
          }
          if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_a8,local_a8);
          }
          pSVar4 = (SSL_METHOD *)TLS_method();
          pSVar5 = (SSL_CTX *)SSL_CTX_new(pSVar4);
          _Var1._M_head_impl = local_90._M_head_impl;
          bVar2 = local_90._M_head_impl != (SSL_CTX *)0x0;
          local_90._M_head_impl = pSVar5;
          if (bVar2) {
            SSL_CTX_free((SSL_CTX *)_Var1._M_head_impl);
          }
          local_d0.data_._0_1_ = local_90._M_head_impl != (SSL_CTX *)0x0;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_90._M_head_impl == (SSL_CTX *)0x0) {
            testing::Message::Message((Message *)&local_b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_b0,(internal *)&local_d0,(AssertionResult *)0x336329,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2405,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_b8);
          }
          else {
            SSL_CTX_set_permute_extensions(local_90._M_head_impl,1);
            bVar2 = GetExtensionOrder(local_90._M_head_impl,
                                      (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                      local_88,ech_keys._M_head_impl,local_d3);
            local_d0.data_._0_1_ = bVar2;
            local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar2) {
              local_d0.data_ = (AssertHelperData *)((long)pbStack_80 - (long)local_88 >> 1);
              local_b8.data_._0_4_ = 5;
              testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
                        ((internal *)local_b0,"order1.size()","5u",(unsigned_long *)&local_d0,
                         (uint *)&local_b8);
              if (local_b0[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_d0);
                pcVar6 = "";
                if (local_a8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_a8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x2413,pcVar6);
                testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
                testing::internal::AssertHelper::~AssertHelper(&local_b8);
                if (local_d0.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_d0.data_ + 8))();
                }
              }
              if (local_a8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_a8,local_a8);
              }
              iVar7 = 0xe;
              while( true ) {
                bVar2 = GetExtensionOrder(local_90._M_head_impl,&local_58,ech_keys._M_head_impl,
                                          local_d3);
                local_d0.data_._0_1_ = bVar2;
                local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!bVar2) break;
                if (((long)pbStack_80 - (long)local_88 !=
                     (long)local_58.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start) ||
                   (((undefined1  [8])pbStack_80 != local_88 &&
                    (iVar3 = bcmp((void *)local_88,
                                  local_58.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)pbStack_80 - (long)local_88), iVar3 != 0))))
                goto LAB_001d5dac;
                iVar7 = iVar7 + -1;
                if (iVar7 == 0) goto code_r0x001d5ce6;
              }
              testing::Message::Message((Message *)&local_b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_b0,(internal *)&local_d0,
                         (AssertionResult *)
                         "GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x2418,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
              testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_b8);
            }
            else {
              testing::Message::Message((Message *)&local_b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_b0,(internal *)&local_d0,
                         (AssertionResult *)
                         "GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x2412,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
              testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_b8);
            }
          }
        }
        else {
          testing::Message::Message((Message *)&local_b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_b0,(internal *)&local_d0,
                     (AssertionResult *)
                     "GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech)","false","true"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2401,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_b8);
        }
      }
      else {
        testing::Message::Message((Message *)&local_b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b0,(internal *)&local_d0,
                   (AssertionResult *)
                   "GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x23ff,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_b8);
      }
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))();
      }
      if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c8,local_c8);
      }
      bVar2 = false;
      goto LAB_001d5faa;
    }
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)local_88,(AssertionResult *)0x336329,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x23fc,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
    }
    if (local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_58.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_90);
    testing::ScopedTrace::~ScopedTrace(&local_b9);
    goto LAB_001d61b6;
  }
  testing::ScopedTrace::~ScopedTrace(&local_b9);
  goto LAB_001d5ffe;
code_r0x001d5ce6:
  local_d0.data_ = local_d0.data_ & 0xffffffffffffff00;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 0x10),
             "Extensions were not permuted",0x1c);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_b0,(internal *)&local_d0,(AssertionResult *)"passed","false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
             ,0x241e,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))();
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
LAB_001d5dac:
  bVar2 = true;
LAB_001d5faa:
  if (local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88,(long)local_78 - (long)local_88);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_90);
  testing::ScopedTrace::~ScopedTrace(&local_b9);
  if (!bVar2) {
LAB_001d61b6:
    testing::ScopedTrace::~ScopedTrace(&local_d2);
    goto LAB_001d61c0;
  }
LAB_001d5ffe:
  lVar8 = lVar8 + 1;
  if (lVar8 == 2) goto code_r0x001d600b;
  goto LAB_001d59d9;
code_r0x001d600b:
  testing::ScopedTrace::~ScopedTrace(&local_d2);
  lVar8 = local_38 + 1;
  if (lVar8 == 2) goto LAB_001d61c0;
  goto LAB_001d599a;
}

Assistant:

TEST(SSLTest, PermuteExtensions) {
  bssl::UniquePtr<SSL_ECH_KEYS> keys = MakeTestECHKeys();
  ASSERT_TRUE(keys);
  for (bool offer_ech : {false, true}) {
    SCOPED_TRACE(offer_ech);
    SSL_ECH_KEYS *maybe_keys = offer_ech ? keys.get() : nullptr;
    for (bool decrypt_ech : {false, true}) {
      SCOPED_TRACE(decrypt_ech);
      if (!offer_ech && decrypt_ech) {
        continue;
      }

      // When extension permutation is disabled, the order should be consistent.
      bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
      ASSERT_TRUE(ctx);
      std::vector<uint16_t> order1, order2;
      ASSERT_TRUE(
          GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech));
      ASSERT_TRUE(
          GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech));
      EXPECT_EQ(order1, order2);

      ctx.reset(SSL_CTX_new(TLS_method()));
      ASSERT_TRUE(ctx);
      SSL_CTX_set_permute_extensions(ctx.get(), 1);

      // When extension permutation is enabled, each ClientHello should have a
      // different order.
      //
      // This test is inherently flaky, so we run it multiple times. We send at
      // least five extensions by default from TLS 1.3: supported_versions,
      // key_share, supported_groups, psk_key_exchange_modes, and
      // signature_algorithms. That means the probability of a false negative is
      // at most 1/120. Repeating the test 14 times lowers false negative rate
      // to under 2^-96.
      ASSERT_TRUE(
          GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech));
      EXPECT_GE(order1.size(), 5u);
      static const int kNumIterations = 14;
      bool passed = false;
      for (int i = 0; i < kNumIterations; i++) {
        ASSERT_TRUE(
            GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech));
        if (order1 != order2) {
          passed = true;
          break;
        }
      }
      EXPECT_TRUE(passed) << "Extensions were not permuted";
    }
  }
}